

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  ZSTD_matchState_t *pZVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  seqDef *psVar10;
  uint uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  BYTE *litEnd;
  int iVar14;
  int *piVar15;
  U32 UVar16;
  int *piVar17;
  int iVar18;
  ulong uVar19;
  int *ip;
  int *ip_00;
  long lVar20;
  int *piVar21;
  U32 local_e8;
  U32 local_e4;
  size_t offset2;
  BYTE *local_c8;
  BYTE *local_c0;
  BYTE *local_b8;
  ZSTD_matchState_t *local_b0;
  size_t local_a8;
  int *local_a0;
  int local_94;
  int local_90;
  int local_8c;
  BYTE *litLimit_w;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  seqStore_t *local_68;
  U32 *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  int *local_40;
  ulong local_38;
  
  local_c0 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_c8 = local_c0 + uVar2;
  pZVar3 = ms->dictMatchState;
  local_b8 = (pZVar3->window).nextSrc;
  local_78 = (pZVar3->window).base;
  local_70 = local_78 + (pZVar3->window).dictLimit;
  iVar18 = (int)local_b8;
  local_38 = (ulong)(((int)local_78 - iVar18) + uVar2);
  iVar14 = (int)local_c0;
  local_8c = (1 - uVar2) - iVar14;
  local_e8 = *rep;
  local_e4 = rep[1];
  local_80 = local_78 + -local_38;
  iEnd = (BYTE *)((long)src + srcSize);
  local_a0 = (int *)((long)src + (srcSize - 8));
  litLimit_w = (BYTE *)((long)src + (srcSize - 0x20));
  local_94 = -iVar14;
  local_90 = (((iVar18 - uVar2) - (int)local_78) - iVar14) + 1;
  ip_00 = (int *)((ulong)(((int)src - ((int)local_70 + (int)local_c8)) + iVar18 == 0) + (long)src);
  local_68 = seqStore;
  local_60 = rep;
  do {
    while( true ) {
      if (local_a0 <= ip_00) {
        *local_60 = local_e8;
        local_60[1] = local_e4;
        return (long)iEnd - (long)src;
      }
      iVar14 = (int)ip_00;
      uVar6 = ((iVar14 - (int)local_c0) - local_e8) + 1;
      piVar21 = (int *)(local_c0 + uVar6);
      if (uVar6 < uVar2) {
        piVar21 = (int *)(local_78 + (uVar6 - (int)local_38));
      }
      if ((uVar6 - uVar2 < 0xfffffffd) && (*piVar21 == *(int *)((long)ip_00 + 1))) {
        pBVar12 = iEnd;
        if (uVar6 < uVar2) {
          pBVar12 = local_b8;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)ip_00 + 5),(BYTE *)(piVar21 + 1),iEnd,pBVar12,local_c8);
        uVar19 = sVar7 + 4;
      }
      else {
        uVar19 = 0;
      }
      offset2 = 999999999;
      sVar7 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS(ms,(BYTE *)ip_00,iEnd,&offset2);
      uVar9 = uVar19;
      if (uVar19 < sVar7) {
        uVar9 = sVar7;
      }
      if (3 < uVar9) break;
      ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
    }
    piVar21 = ip_00;
    sVar8 = offset2;
    if (sVar7 <= uVar19) {
      piVar21 = (int *)((long)ip_00 + 1);
      sVar8 = 0;
    }
    local_48 = (ulong)((local_8c - local_e8) + iVar14);
    local_50 = (ulong)((local_94 - local_e8) + iVar14);
    local_58 = (ulong)((local_90 - local_e8) + iVar14);
    piVar17 = ip_00;
    local_b0 = ms;
    for (lVar20 = 0; sVar7 = uVar9, (int *)(lVar20 + (long)ip_00) < local_a0; lVar20 = lVar20 + 1) {
      ip = (int *)((long)ip_00 + lVar20 + 1);
      iVar14 = (int)lVar20;
      uVar6 = (int)local_50 + iVar14 + 1;
      piVar15 = (int *)(local_c0 + uVar6);
      if (uVar6 < uVar2) {
        piVar15 = (int *)(local_78 + (uint)((int)local_58 + iVar14));
      }
      local_a8 = sVar8;
      local_40 = piVar17;
      if (((uint)((int)local_48 + iVar14) < 0xfffffffd) && (*piVar15 == *ip)) {
        pBVar12 = iEnd;
        if (uVar6 < uVar2) {
          pBVar12 = local_b8;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip_00 + lVar20 + 5),(BYTE *)(piVar15 + 1),iEnd,pBVar12,
                           local_c8);
        if (sVar8 < 0xfffffffffffffffc) {
          uVar11 = (int)local_a8 + 1;
          uVar6 = 0x1f;
          if (uVar11 != 0) {
            for (; uVar11 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          if ((int)((uVar6 ^ 0x1f) + (int)uVar9 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
            local_a8 = 0;
            sVar7 = sVar8 + 4;
            piVar21 = ip;
          }
        }
      }
      offset2 = 999999999;
      uVar9 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS(local_b0,(BYTE *)ip,iEnd,&offset2);
      sVar8 = local_a8;
      if (uVar9 < 4) break;
      uVar11 = (int)local_a8 + 1;
      uVar6 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar11 = (int)offset2 + 1;
      iVar14 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar14 == 0; iVar14 = iVar14 + -1) {
        }
      }
      if ((int)uVar9 * 4 - iVar14 <= (int)((uVar6 ^ 0x1f) + (int)sVar7 * 4 + -0x1b)) break;
      piVar17 = (int *)((long)local_40 + 1);
      sVar8 = offset2;
      piVar21 = piVar17;
    }
    psVar5 = local_68;
    if (sVar8 == 0) {
      UVar16 = 1;
    }
    else {
      uVar19 = (long)piVar21 + (-(long)local_c0 - sVar8) + -0xfffffffe;
      pBVar13 = local_c0;
      pBVar12 = local_c8;
      if ((uint)uVar19 < uVar2) {
        pBVar13 = local_80;
        pBVar12 = local_70;
      }
      pBVar13 = pBVar13 + (uVar19 & 0xffffffff);
      for (; ((src < piVar21 && (pBVar12 < pBVar13)) &&
             (*(BYTE *)((long)piVar21 + -1) == pBVar13[-1])); piVar21 = (int *)((long)piVar21 + -1))
      {
        pBVar13 = pBVar13 + -1;
        sVar7 = sVar7 + 1;
      }
      UVar16 = (int)sVar8 + 1;
      local_e4 = local_e8;
      local_e8 = (int)sVar8 - 2;
    }
    uVar19 = (long)piVar21 - (long)src;
    pBVar12 = local_68->lit;
    if (litLimit_w < piVar21) {
      ZSTD_safecopyLiterals(pBVar12,(BYTE *)src,(BYTE *)piVar21,litLimit_w);
LAB_0050c505:
      psVar5->lit = psVar5->lit + uVar19;
      psVar10 = psVar5->sequences;
      if (0xffff < uVar19) {
        psVar5->longLengthType = ZSTD_llt_literalLength;
        psVar5->longLengthPos = (U32)((ulong)((long)psVar10 - (long)psVar5->sequencesStart) >> 3);
      }
    }
    else {
      uVar4 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar12 = *src;
      *(undefined8 *)(pBVar12 + 8) = uVar4;
      pBVar12 = local_68->lit;
      if (0x10 < uVar19) {
        uVar4 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar12 + 0x18) = uVar4;
        if (0x20 < (long)uVar19) {
          lVar20 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar20 + 0x20);
            uVar4 = puVar1[1];
            pBVar13 = pBVar12 + lVar20 + 0x20;
            *(undefined8 *)pBVar13 = *puVar1;
            *(undefined8 *)(pBVar13 + 8) = uVar4;
            puVar1 = (undefined8 *)((long)src + lVar20 + 0x30);
            uVar4 = puVar1[1];
            *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar13 + 0x18) = uVar4;
            lVar20 = lVar20 + 0x20;
          } while (pBVar13 + 0x20 < pBVar12 + uVar19);
        }
        goto LAB_0050c505;
      }
      local_68->lit = pBVar12 + uVar19;
      psVar10 = local_68->sequences;
    }
    psVar10->litLength = (U16)uVar19;
    psVar10->offset = UVar16;
    if (0xffff < sVar7 - 3) {
      psVar5->longLengthType = ZSTD_llt_matchLength;
      psVar5->longLengthPos = (U32)((ulong)((long)psVar10 - (long)psVar5->sequencesStart) >> 3);
    }
    psVar10->matchLength = (U16)(sVar7 - 3);
    psVar5->sequences = psVar10 + 1;
    UVar16 = local_e4;
    for (src = (void *)((long)piVar21 + sVar7); local_e4 = UVar16, ip_00 = (int *)src, ms = local_b0
        , src <= local_a0; src = (void *)((long)src + sVar7 + 4)) {
      uVar6 = ((int)src - (int)local_c0) - local_e4;
      pBVar12 = local_c0;
      if (uVar6 < uVar2) {
        pBVar12 = local_80;
      }
      if ((0xfffffffc < uVar6 - uVar2) || (*(int *)(pBVar12 + uVar6) != *src)) break;
      pBVar13 = iEnd;
      if (uVar6 < uVar2) {
        pBVar13 = local_b8;
      }
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar12 + uVar6) + 4),iEnd,pBVar13,
                         local_c8);
      pBVar12 = psVar5->lit;
      if (litLimit_w < src) {
        ZSTD_safecopyLiterals(pBVar12,(BYTE *)src,(BYTE *)src,litLimit_w);
      }
      else {
        uVar4 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar12 = *src;
        *(undefined8 *)(pBVar12 + 8) = uVar4;
      }
      psVar10 = psVar5->sequences;
      psVar10->litLength = 0;
      psVar10->offset = 1;
      if (0xffff < sVar7 + 1) {
        psVar5->longLengthType = ZSTD_llt_matchLength;
        psVar5->longLengthPos = (U32)((ulong)((long)psVar10 - (long)psVar5->sequencesStart) >> 3);
      }
      psVar10->matchLength = (U16)(sVar7 + 1);
      psVar5->sequences = psVar10 + 1;
      UVar16 = local_e8;
      local_e8 = local_e4;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dictMatchState);
}